

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkPipelineMultisampleStateCreateInfo * __thiscall
Fossilize::StateRecorder::Impl::copy<VkPipelineMultisampleStateCreateInfo>
          (Impl *this,VkPipelineMultisampleStateCreateInfo *src,size_t count,ScratchAllocator *alloc
          )

{
  VkPipelineMultisampleStateCreateInfo *pVVar1;
  
  if (count != 0) {
    pVVar1 = ScratchAllocator::allocate_n<VkPipelineMultisampleStateCreateInfo>(alloc,count);
    if (pVVar1 != (VkPipelineMultisampleStateCreateInfo *)0x0) {
      pVVar1 = (VkPipelineMultisampleStateCreateInfo *)memmove(pVVar1,src,count * 0x30);
      return pVVar1;
    }
  }
  return (VkPipelineMultisampleStateCreateInfo *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}